

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,UChar *buff,int32_t buffLength,int32_t buffCapacity)

{
  long lVar1;
  int16_t iVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003febe0
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if (buff == (UChar *)0x0) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  else if (((buffCapacity < buffLength) || (buffLength < -1)) || (buffCapacity < 0)) {
    setToBogus(this);
  }
  else {
    if (buffLength == -1) {
      pUVar4 = buff;
      if (buffCapacity != 0) {
        lVar1 = (ulong)(uint)buffCapacity * 2;
        pUVar3 = buff;
        do {
          pUVar4 = pUVar3;
          if (*pUVar3 == L'\0') break;
          pUVar3 = pUVar3 + 1;
          lVar1 = lVar1 + -2;
          pUVar4 = buff + (uint)buffCapacity;
        } while (lVar1 != 0);
      }
      buffLength = (int32_t)((ulong)((long)pUVar4 - (long)buff) >> 1);
    }
    if (buffLength < 0x400) {
      iVar2 = (int16_t)(buffLength << 5);
    }
    else {
      (this->fUnion).fFields.fLength = buffLength;
      iVar2 = -0x20;
    }
    (this->fUnion).fStackFields.fLengthAndFlags = iVar2;
    (this->fUnion).fFields.fArray = buff;
    (this->fUnion).fFields.fCapacity = buffCapacity;
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar *buff,
                             int32_t buffLength,
                             int32_t buffCapacity) {
  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  if(buff == NULL) {
    // treat as an empty string, do not alias
    setToEmpty();
  } else if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
  } else {
    if(buffLength == -1) {
      // fLength = u_strlen(buff); but do not look beyond buffCapacity
      const UChar *p = buff, *limit = buff + buffCapacity;
      while(p != limit && *p != 0) {
        ++p;
      }
      buffLength = (int32_t)(p - buff);
    }
    setArray(buff, buffLength, buffCapacity);
  }
}